

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O3

void __thiscall
OpenMD::OpenMDBitSet::setBits(OpenMDBitSet *this,size_t fromIndex,size_t toIndex,bool value)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *__s;
  size_t sVar7;
  char cVar8;
  uint uVar9;
  ulong *puVar10;
  
  sVar4 = fromIndex + 0x3f;
  if (-1 < (long)fromIndex) {
    sVar4 = fromIndex;
  }
  uVar6 = (ulong)((fromIndex & 0x800000000000003f) < 0x8000000000000001);
  sVar7 = toIndex + 0x3f;
  if (-1 < (long)toIndex) {
    sVar7 = toIndex;
  }
  lVar2 = (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  lVar1 = lVar2 + ((long)sVar4 >> 6) * 8;
  __s = (ulong *)(lVar1 + -8 + uVar6 * 8);
  uVar5 = (ulong)((toIndex & 0x800000000000003f) < 0x8000000000000001);
  lVar2 = lVar2 + ((long)sVar7 >> 6) * 8;
  uVar9 = (uint)toIndex & 0x3f;
  cVar8 = (char)uVar9;
  bVar3 = (byte)fromIndex;
  if (lVar1 + uVar6 * 8 == lVar2 + uVar5 * 8) {
    if (((uint)fromIndex & 0x3f) != uVar9) {
      uVar6 = ((0xffffffffffffffffU >> (-cVar8 & 0x3fU)) >> (bVar3 & 0x3f)) << (bVar3 & 0x3f);
      if (value) {
        uVar6 = uVar6 | *__s;
      }
      else {
        uVar6 = ~uVar6 & *__s;
      }
      *__s = uVar6;
    }
  }
  else {
    puVar10 = (ulong *)(lVar2 + uVar5 * 8 + -8);
    if ((fromIndex & 0x3f) != 0) {
      uVar6 = -1L << (bVar3 & 0x3f);
      if (value) {
        uVar6 = uVar6 | *__s;
      }
      else {
        uVar6 = ~uVar6 & *__s;
      }
      *__s = uVar6;
      __s = __s + 1;
    }
    memset(__s,(uint)(byte)-value,(long)puVar10 - (long)__s);
    if ((toIndex & 0x3f) != 0) {
      uVar6 = 0xffffffffffffffff >> (-cVar8 & 0x3fU);
      if (value) {
        uVar6 = uVar6 | *puVar10;
      }
      else {
        uVar6 = ~uVar6 & *puVar10;
      }
      *puVar10 = uVar6;
    }
  }
  return;
}

Assistant:

void OpenMDBitSet::setBits(size_t fromIndex, size_t toIndex, bool value) {
    assert(fromIndex <= toIndex);
    assert(fromIndex >= 0);
    assert(toIndex <= size());
    std::vector<bool>::iterator first = bitset_.begin() + fromIndex;
    std::vector<bool>::iterator last  = bitset_.begin() + toIndex;
    std::fill(first, last, value);
  }